

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O2

void duckdb_zstd::HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  BYTE *pBVar4;
  BYTE *pBVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  U64 UVar14;
  ulong *puVar15;
  ulong *puVar16;
  ulong *puVar17;
  ulong uVar18;
  U64 UVar19;
  U64 UVar20;
  ulong *puVar21;
  ulong uVar22;
  U64 UVar23;
  ulong *local_60;
  BYTE *local_58;
  
  pvVar3 = args->dt;
  pBVar4 = args->oend;
  pBVar5 = args->ilowest;
  UVar14 = args->bits[0];
  UVar19 = args->bits[1];
  UVar23 = args->bits[2];
  UVar20 = args->bits[3];
  puVar21 = (ulong *)args->ip[0];
  puVar17 = (ulong *)args->ip[1];
  puVar16 = (ulong *)args->ip[2];
  puVar15 = (ulong *)args->ip[3];
  pBVar13 = args->op[0];
  pBVar11 = args->op[1];
  local_58 = args->op[2];
  pBVar12 = args->op[3];
  local_60 = puVar21;
  while( true ) {
    uVar8 = (ulong)((long)pBVar4 - (long)pBVar12) / 5;
    uVar9 = (ulong)((long)local_60 - (long)pBVar5) / 7;
    if (uVar8 < uVar9) {
      uVar9 = uVar8;
    }
    if ((((uVar9 == 0) || (puVar17 < local_60)) || (puVar16 < puVar17)) || (puVar15 < puVar16))
    break;
    pBVar10 = pBVar12 + uVar9 * 5;
    do {
      local_60 = puVar21;
      uVar1 = *(ushort *)((long)pvVar3 + (UVar14 >> 0x35) * 2);
      uVar9 = UVar14 << ((ulong)uVar1 & 0x3f);
      *pBVar13 = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (UVar19 >> 0x35) * 2);
      uVar8 = UVar19 << ((ulong)uVar1 & 0x3f);
      *pBVar11 = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (UVar23 >> 0x35) * 2);
      uVar22 = UVar23 << ((ulong)uVar1 & 0x3f);
      *local_58 = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (UVar20 >> 0x35) * 2);
      uVar18 = UVar20 << ((ulong)uVar1 & 0x3f);
      *pBVar12 = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
      uVar9 = uVar9 << ((ulong)uVar1 & 0x3f);
      pBVar13[1] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar8 >> 0x35) * 2);
      uVar8 = uVar8 << ((ulong)uVar1 & 0x3f);
      pBVar11[1] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar22 >> 0x35) * 2);
      uVar22 = uVar22 << ((ulong)uVar1 & 0x3f);
      local_58[1] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar18 >> 0x35) * 2);
      uVar18 = uVar18 << ((ulong)uVar1 & 0x3f);
      pBVar12[1] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
      uVar9 = uVar9 << ((ulong)uVar1 & 0x3f);
      pBVar13[2] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar8 >> 0x35) * 2);
      uVar8 = uVar8 << ((ulong)uVar1 & 0x3f);
      pBVar11[2] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar22 >> 0x35) * 2);
      uVar22 = uVar22 << ((ulong)uVar1 & 0x3f);
      local_58[2] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar18 >> 0x35) * 2);
      uVar18 = uVar18 << ((ulong)uVar1 & 0x3f);
      pBVar12[2] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
      uVar9 = uVar9 << ((ulong)uVar1 & 0x3f);
      pBVar13[3] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar8 >> 0x35) * 2);
      uVar8 = uVar8 << ((ulong)uVar1 & 0x3f);
      pBVar11[3] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar22 >> 0x35) * 2);
      uVar22 = uVar22 << ((ulong)uVar1 & 0x3f);
      local_58[3] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar18 >> 0x35) * 2);
      uVar18 = uVar18 << ((ulong)uVar1 & 0x3f);
      pBVar12[3] = (BYTE)(uVar1 >> 8);
      uVar1 = *(ushort *)((long)pvVar3 + (uVar9 >> 0x35) * 2);
      pBVar13[4] = (BYTE)(uVar1 >> 8);
      uVar2 = *(ushort *)((long)pvVar3 + (uVar8 >> 0x35) * 2);
      uVar8 = uVar8 << ((ulong)uVar2 & 0x3f);
      pBVar11[4] = (BYTE)(uVar2 >> 8);
      uVar2 = *(ushort *)((long)pvVar3 + (uVar22 >> 0x35) * 2);
      uVar22 = uVar22 << ((ulong)uVar2 & 0x3f);
      local_58[4] = (BYTE)(uVar2 >> 8);
      uVar2 = *(ushort *)((long)pvVar3 + (uVar18 >> 0x35) * 2);
      uVar18 = uVar18 << ((ulong)uVar2 & 0x3f);
      pBVar12[4] = (BYTE)(uVar2 >> 8);
      uVar6 = 0;
      for (uVar9 = uVar9 << ((ulong)uVar1 & 0x3f); (uVar9 & 1) == 0;
          uVar9 = uVar9 >> 1 | 0x8000000000000000) {
        uVar6 = uVar6 + 1;
      }
      puVar21 = (ulong *)((long)local_60 - (ulong)(uVar6 >> 3));
      UVar14 = (*puVar21 | 1) << ((byte)uVar6 & 7);
      uVar7 = 0;
      for (; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
        uVar7 = uVar7 + 1;
      }
      puVar17 = (ulong *)((long)puVar17 - (ulong)(uVar7 >> 3));
      UVar19 = (*puVar17 | 1) << ((byte)uVar7 & 7);
      uVar7 = 0;
      for (; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x8000000000000000) {
        uVar7 = uVar7 + 1;
      }
      puVar16 = (ulong *)((long)puVar16 - (ulong)(uVar7 >> 3));
      UVar23 = (*puVar16 | 1) << ((byte)uVar7 & 7);
      uVar7 = 0;
      for (; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x8000000000000000) {
        uVar7 = uVar7 + 1;
      }
      puVar15 = (ulong *)((long)puVar15 - (ulong)(uVar7 >> 3));
      UVar20 = (*puVar15 | 1) << ((byte)uVar7 & 7);
      pBVar13 = pBVar13 + 5;
      pBVar11 = pBVar11 + 5;
      local_58 = local_58 + 5;
      pBVar12 = pBVar12 + 5;
    } while (pBVar12 < pBVar10);
    local_60 = (ulong *)((long)local_60 - (ulong)(uVar6 >> 3));
  }
  args->bits[0] = UVar14;
  args->bits[1] = UVar19;
  args->bits[2] = UVar23;
  args->bits[3] = UVar20;
  args->ip[0] = (BYTE *)puVar21;
  args->ip[1] = (BYTE *)puVar17;
  args->ip[2] = (BYTE *)puVar16;
  args->ip[3] = (BYTE *)puVar15;
  args->op[0] = pBVar13;
  args->op[1] = pBVar11;
  args->op[2] = local_58;
  args->op[3] = pBVar12;
  return;
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilowest = args->ilowest;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilowest);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilowest) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we reach the end. */
            if (op[3] == olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

#define HUF_4X1_DECODE_SYMBOL(_stream, _symbol)                 \
    do {                                                        \
        int const index = (int)(bits[(_stream)] >> 53);         \
        int const entry = (int)dtable[index];                   \
        bits[(_stream)] <<= (entry & 0x3F);                     \
        op[(_stream)][(_symbol)] = (BYTE)((entry >> 8) & 0xFF); \
    } while (0)

#define HUF_4X1_RELOAD_STREAM(_stream)                              \
    do {                                                            \
        int const ctz = ZSTD_countTrailingZeros64(bits[(_stream)]); \
        int const nbBits = ctz & 7;                                 \
        int const nbBytes = ctz >> 3;                               \
        op[(_stream)] += 5;                                         \
        ip[(_stream)] -= nbBytes;                                   \
        bits[(_stream)] = MEM_read64(ip[(_stream)]) | 1;            \
        bits[(_stream)] <<= nbBits;                                 \
    } while (0)

        /* Manually unroll the loop because compilers don't consistently
         * unroll the inner loops, which destroys performance.
         */
        do {
            /* Decode 5 symbols in each of the 4 streams */
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 0);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 1);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 2);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 3);
            HUF_4X_FOR_EACH_STREAM_WITH_VAR(HUF_4X1_DECODE_SYMBOL, 4);

            /* Reload each of the 4 the bitstreams */
            HUF_4X_FOR_EACH_STREAM(HUF_4X1_RELOAD_STREAM);
        } while (op[3] < olimit);

#undef HUF_4X1_DECODE_SYMBOL
#undef HUF_4X1_RELOAD_STREAM
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}